

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

int Fra_SmlNodeIsConst(Aig_Obj_t *pObj)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = *(long *)((long)(pObj->field_5).pData + 0x38);
  lVar3 = (long)*(int *)(lVar2 + 0x18);
  do {
    if (*(int *)(lVar2 + 0x14) <= lVar3) {
      return 1;
    }
    lVar1 = lVar3 * 4;
    lVar3 = lVar3 + 1;
  } while (*(int *)(lVar2 + (long)(pObj->Id * *(int *)(lVar2 + 0x14)) * 4 + 0x28 + lVar1) == 0);
  return 0;
}

Assistant:

int Fra_SmlNodeIsConst( Aig_Obj_t * pObj )
{
    Fra_Man_t * p = (Fra_Man_t *)pObj->pData;
    unsigned * pSims;
    int i;
    pSims = Fra_ObjSim(p->pSml, pObj->Id);
    for ( i = p->pSml->nWordsPref; i < p->pSml->nWordsTotal; i++ )
        if ( pSims[i] )
            return 0;
    return 1;
}